

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O2

vec<3U,_float> * __thiscall
crnlib::vec<3u,float>::operator=(vec<3u,float> *this,vec<3U,_double> *other)

{
  long lVar1;
  
  if (this != (vec<3u,float> *)other) {
    for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
      *(float *)(this + lVar1 * 4) = (float)other->m_s[lVar1];
    }
  }
  return (vec<3U,_float> *)this;
}

Assistant:

inline vec& operator=(const vec<O, U>& other)
        {
            if ((void*)this == (void*)&other)
            {
                return *this;
            }

            uint s = math::minimum(N, O);

            uint i;
            for (i = 0; i < s; i++)
            {
                m_s[i] = static_cast<T>(other[i]);
            }

            for (; i < N; i++)
            {
                m_s[i] = 0;
            }

            return *this;
        }